

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::UntypedMapBase::UntypedSwap(UntypedMapBase *this,UntypedMapBase *other)

{
  bool bVar1;
  Arena *pAVar2;
  Arena *pAVar3;
  LogMessage *pLVar4;
  LogMessage local_50;
  Voidify local_3d;
  TypeInfo local_3c;
  undefined1 local_38 [8];
  UntypedMapBase tmp;
  UntypedMapBase *other_local;
  UntypedMapBase *this_local;
  
  tmp.arena_ = (Arena *)other;
  pAVar2 = arena(this);
  pAVar3 = arena((UntypedMapBase *)tmp.arena_);
  if (pAVar2 == pAVar3) {
    InternalSwap(this,(UntypedMapBase *)tmp.arena_);
  }
  else {
    local_3c = this->type_info_;
    UntypedMapBase((UntypedMapBase *)local_38,this->arena_,local_3c);
    InternalSwap(this,(UntypedMapBase *)local_38);
    bVar1 = empty(this);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc"
                 ,0x62,"empty()");
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_3d,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_50);
    }
    UntypedMergeFrom(this,(UntypedMapBase *)tmp.arena_);
    ClearTable((UntypedMapBase *)tmp.arena_,true);
    UntypedMergeFrom((UntypedMapBase *)tmp.arena_,(UntypedMapBase *)local_38);
    if (this->arena_ == (Arena *)0x0) {
      ClearTable((UntypedMapBase *)local_38,false);
    }
  }
  return;
}

Assistant:

void UntypedMapBase::UntypedSwap(UntypedMapBase& other) {
  if (arena() == other.arena()) {
    InternalSwap(&other);
  } else {
    UntypedMapBase tmp(arena_, type_info_);
    InternalSwap(&tmp);

    ABSL_DCHECK(empty());
    UntypedMergeFrom(other);

    other.ClearTable(true);
    other.UntypedMergeFrom(tmp);

    if (arena_ == nullptr) tmp.ClearTable(false);
  }
}